

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v6::detail::
       parse_arg_id<char,fmt::v6::detail::width_adapter<fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::detail::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>>&,char>>
                 (char *begin,char *end,
                 width_adapter<fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>_&,_char>
                 *handler)

{
  byte bVar1;
  int id;
  byte *pbVar2;
  byte *pbVar3;
  type tVar4;
  byte *pbVar5;
  basic_string_view<char> id_00;
  char *in_stack_ffffffffffffffd8;
  
  if (begin == end) {
    assert_fail(begin,0,in_stack_ffffffffffffffd8);
  }
  bVar1 = *begin;
  pbVar5 = (byte *)begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    width_adapter<fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>_&,_char>
    ::operator()(handler);
  }
  else if ((byte)(bVar1 - 0x30) < 10) {
    if (bVar1 == 0x30) {
      id = 0;
      pbVar5 = (byte *)(begin + 1);
    }
    else {
      id = parse_nonnegative_int<char,fmt::v6::detail::width_adapter<fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::detail::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>>&,char>&>
                     ((char **)&stack0xffffffffffffffe0,end,handler);
      pbVar5 = (byte *)begin;
    }
    if ((pbVar5 == (byte *)end) || ((*pbVar5 != 0x3a && (*pbVar5 != 0x7d)))) {
      width_adapter<fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>_&,_char>
      ::on_error(handler,"invalid format string");
    }
    else {
      width_adapter<fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>_&,_char>
      ::operator()(handler,id);
    }
  }
  else if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
    pbVar3 = (byte *)(begin + 1);
    do {
      pbVar2 = pbVar3;
      pbVar5 = (byte *)end;
      if (pbVar2 == (byte *)end) break;
      bVar1 = *pbVar2;
      pbVar3 = pbVar2 + 1;
    } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
            (pbVar5 = pbVar2, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
    tVar4 = to_unsigned<long>((long)pbVar5 - (long)begin);
    id_00.size_ = tVar4;
    id_00.data_ = begin;
    width_adapter<fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>_&,_char>
    ::operator()(handler,id_00);
  }
  else {
    width_adapter<fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>_&,_char>
    ::on_error(handler,"invalid format string");
  }
  return (char *)pbVar5;
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = 0;
    if (c != '0')
      index = parse_nonnegative_int(begin, end, handler);
    else
      ++begin;
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}